

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v8::detail::value<fmt::v8::basic_format_context<fmt::v8::appender,char>>::
     format_custom_arg<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,fmt::v8::formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v8::appender,_char> *ctx)

{
  iterator it;
  basic_format_context<fmt::v8::appender,_char> *in_RDX;
  formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
  *in_RSI;
  formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
  f;
  basic_format_context<fmt::v8::appender,_char> *in_stack_00000138;
  dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_00000140;
  formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
  *in_stack_00000148;
  iterator in_stack_ffffffffffffffd8;
  basic_format_parse_context<char,_fmt::v8::detail::error_handler> *in_stack_ffffffffffffffe0;
  
  formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
  ::formatter((formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
               *)&stack0xffffffffffffffe2);
  formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,char,void>
  ::parse<fmt::v8::basic_format_parse_context<char,fmt::v8::detail::error_handler>>
            (in_RSI,(basic_format_parse_context<char,_fmt::v8::detail::error_handler> *)in_RDX);
  basic_format_parse_context<char,_fmt::v8::detail::error_handler>::advance_to
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  it = formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,char,void>
       ::
       format<fmt::v8::basic_format_context<fmt::v8::appender,char>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                 (in_stack_00000148,in_stack_00000140,in_stack_00000138);
  basic_format_context<fmt::v8::appender,_char>::advance_to(in_RDX,it);
  return;
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }